

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O2

int __thiscall Fl_Menu_Item_Type::flags(Fl_Menu_Item_Type *this)

{
  Fl_Widget *pFVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  pFVar1 = (this->super_Fl_Widget_Type).o;
  uVar4 = pFVar1->type_ | 4;
  if (*(char *)((long)&pFVar1[1]._vptr_Fl_Widget + 4) == '\0') {
    uVar4 = (uint)pFVar1->type_;
  }
  uVar4 = (pFVar1->flags_ & 2) << 3 | pFVar1->flags_ & 1 | uVar4;
  iVar3 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x16])();
  if (iVar3 != 0) {
    if ((this->super_Fl_Widget_Type).super_Fl_Type.user_data_ == (char *)0x0) {
      uVar4 = uVar4 | 0x40;
    }
    else {
      uVar4 = uVar4 | 0x20;
    }
  }
  uVar2 = uVar4 | 0x80;
  if ((this->super_Fl_Widget_Type).hotspot_ == '\0') {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

int Fl_Menu_Item_Type::flags() {
  int i = o->type();
  if (((Fl_Button*)o)->value()) i |= FL_MENU_VALUE;
  if (!o->active()) i |= FL_MENU_INACTIVE;
  if (!o->visible()) i |= FL_MENU_INVISIBLE;
  if (is_parent()) {
    if (user_data() == NULL) i |= FL_SUBMENU;
    else i |= FL_SUBMENU_POINTER;
  }
  if (hotspot()) i |= FL_MENU_DIVIDER;
  return i;
}